

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<true>>::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<true>_> *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  bool bVar1;
  byte bVar2;
  sub_match_impl *psVar3;
  undefined8 in_RDX;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool old_zero_width;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *br;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_1;
  
  psVar3 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::sub_match(in_RSI,*(int *)&(in_RDI->cur_)._M_current);
  if (((psVar3->zero_width_ & 1U) == 0) ||
     (bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                         &in_RDI->cur_), !bVar1)) {
    bVar2 = psVar3->zero_width_ & 1;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(CONCAT17(psVar3->zero_width_,in_stack_ffffffffffffffd0) &
                          0x1ffffffffffffff),&in_RDI->cur_);
    psVar3->zero_width_ = bVar1;
    bVar1 = match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                      ((repeat_end_matcher<mpl_::bool_<true>_> *)in_RDI,in_RSI,in_RDX);
    if (bVar1) {
      local_1 = true;
    }
    else {
      psVar3->zero_width_ = (bool)(bVar2 & 1);
      local_1 = false;
    }
  }
  else {
    local_1 = matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::skip_match((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI);
  }
  return local_1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            // prevent repeated zero-width sub-matches from causing infinite recursion
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(br.zero_width_ && br.begin_ == state.cur_)
            {
                return next.skip_match(state);
            }

            bool old_zero_width = br.zero_width_;
            br.zero_width_ = (br.begin_ == state.cur_);

            if(this->match_(state, next, greedy_type()))
            {
                return true;
            }

            br.zero_width_ = old_zero_width;
            return false;
        }